

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O1

bool __thiscall SubprocessSet::DoWork(SubprocessSet *this,TokenPool *tokens)

{
  iterator *piVar1;
  pointer *pppSVar2;
  pointer ppSVar3;
  _Elt_pointer ppSVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  pointer ppSVar8;
  int *piVar9;
  int iVar10;
  fd_set *__arr;
  pointer __src;
  fd_set set;
  fd_set local_a8;
  
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  ppSVar3 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  iVar6 = 0;
  for (ppSVar8 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar8 != ppSVar3; ppSVar8 = ppSVar8 + 1
      ) {
    uVar7 = (*ppSVar8)->fd_;
    if (-1 < (int)uVar7) {
      local_a8.fds_bits[uVar7 >> 6] = local_a8.fds_bits[uVar7 >> 6] | 1L << ((byte)uVar7 & 0x3f);
      if (iVar6 <= (int)uVar7) {
        iVar6 = uVar7 + 1;
      }
    }
  }
  if (tokens != (TokenPool *)0x0) {
    iVar5 = (*tokens->_vptr_TokenPool[7])(tokens);
    iVar10 = iVar5 + 0x3f;
    if (-1 < iVar5) {
      iVar10 = iVar5;
    }
    local_a8.fds_bits[iVar10 >> 6] = local_a8.fds_bits[iVar10 >> 6] | 1L << ((byte)iVar5 & 0x3f);
    if (iVar6 <= iVar5) {
      iVar6 = iVar5 + 1;
    }
  }
  interrupted_ = 0;
  iVar6 = pselect(iVar6,&local_a8,(fd_set *)0x0,(fd_set *)0x0,(timespec *)0x0,
                  (__sigset_t *)&this->old_mask_);
  if (iVar6 == -1) {
    piVar9 = __errno_location();
    if (*piVar9 != 4) {
      perror("ninja: pselect");
      return false;
    }
  }
  else {
    HandlePendingInterruption();
    if (interrupted_ != 0) {
      return true;
    }
    ppSVar8 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar8 !=
        (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        uVar7 = (*ppSVar8)->fd_;
        if (((int)uVar7 < 0) ||
           (((ulong)local_a8.fds_bits[uVar7 >> 6] >> ((ulong)uVar7 & 0x3f) & 1) == 0)) {
LAB_00124067:
          ppSVar8 = ppSVar8 + 1;
        }
        else {
          Subprocess::OnPipeReady(*ppSVar8);
          if ((*ppSVar8)->fd_ != -1) goto LAB_00124067;
          ppSVar4 = (this->finished_).c.
                    super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (ppSVar4 ==
              (this->finished_).c.super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<Subprocess*,std::allocator<Subprocess*>>::_M_push_back_aux<Subprocess*const&>
                      ((deque<Subprocess*,std::allocator<Subprocess*>> *)&this->finished_,ppSVar8);
          }
          else {
            *ppSVar4 = *ppSVar8;
            piVar1 = &(this->finished_).c.
                      super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                      super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
          __src = ppSVar8 + 1;
          ppSVar3 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (__src != ppSVar3) {
            memmove(ppSVar8,__src,(long)ppSVar3 - (long)__src);
          }
          pppSVar2 = &(this->running_).
                      super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppSVar2 = *pppSVar2 + -1;
        }
      } while (ppSVar8 !=
               (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    if (tokens != (TokenPool *)0x0) {
      uVar7 = (*tokens->_vptr_TokenPool[7])(tokens);
      if ((-1 < (int)uVar7) &&
         (((ulong)local_a8.fds_bits[uVar7 >> 6] >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
        this->token_available_ = true;
      }
    }
  }
  return interrupted_ != 0;
}

Assistant:

bool SubprocessSet::DoWork(TokenPool* tokens) {
  fd_set set;
  int nfds = 0;
  FD_ZERO(&set);

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i) {
    int fd = (*i)->fd_;
    if (fd >= 0) {
      FD_SET(fd, &set);
      if (nfds < fd+1)
        nfds = fd+1;
    }
  }

  if (tokens) {
    int fd = tokens->GetMonitorFd();
    FD_SET(fd, &set);
    if (nfds < fd+1)
      nfds = fd+1;
  }

  interrupted_ = 0;
  int ret = pselect(nfds, &set, 0, 0, 0, &old_mask_);
  if (ret == -1) {
    if (errno != EINTR) {
      perror("ninja: pselect");
      return false;
    }
    return IsInterrupted();
  }

  HandlePendingInterruption();
  if (IsInterrupted())
    return true;

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ) {
    int fd = (*i)->fd_;
    if (fd >= 0 && FD_ISSET(fd, &set)) {
      (*i)->OnPipeReady();
      if ((*i)->Done()) {
        finished_.push(*i);
        i = running_.erase(i);
        continue;
      }
    }
    ++i;
  }

  if (tokens) {
    int fd = tokens->GetMonitorFd();
    if ((fd >= 0) && FD_ISSET(fd, &set))
    token_available_ = true;
  }

  return IsInterrupted();
}